

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O1

void __thiscall nivalis::anon_unknown_3::Differentiator::end_thunk(Differentiator *this)

{
  pointer *ppuVar1;
  vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>> *this_00;
  _OpCode local_14;
  unsigned_long local_10;
  
  this_00 = (vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>> *)this->out;
  local_14 = thunk_jmp;
  local_10 = (*(long *)(this_00 + 8) - *(long *)this_00 >> 4) -
             (this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
  std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>::
  emplace_back<nivalis::OpCode::_OpCode,unsigned_long>(this_00,&local_14,&local_10);
  ppuVar1 = &(this->thunks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + -1;
  return;
}

Assistant:

void end_thunk() {
        out.emplace_back(OpCode::thunk_jmp,
                    out.size() - thunks.back());
        thunks.pop_back();
    }